

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkObjOrder(Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vNameIds)

{
  uint uVar1;
  uint uVar2;
  int Entry;
  uint *__ptr;
  void *pvVar3;
  Cba_Man_t *pCVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  char Buffer [1000];
  char local_418 [1000];
  
  uVar1 = vObjs->nSize;
  if ((int)uVar1 < 2) {
    return;
  }
  __ptr = (uint *)malloc(0x10);
  uVar11 = 8;
  if (8 < uVar1) {
    uVar11 = (ulong)uVar1;
  }
  __ptr[1] = 0;
  *__ptr = (uint)uVar11;
  pvVar3 = malloc(uVar11 << 3);
  *(void **)(__ptr + 2) = pvVar3;
  if (0 < vObjs->nSize) {
    lVar14 = 0;
    lVar12 = 0;
    do {
      uVar1 = *(uint *)((long)vObjs->pArray + lVar14);
      lVar10 = (long)(int)uVar1;
      if (lVar10 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                      ,0x142,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= (int)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      pCVar4 = p->pDesign;
      pcVar7 = pCVar4->pTypeNames[(byte)(p->vObjType).pArray[lVar10]];
      if (vNameIds == (Vec_Int_t *)0x0) {
        if ((p->vObjName).nSize < 1) {
          __assert_fail("Cba_NtkHasObjNames(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                        ,0x15d,"int Cba_ObjName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(&p->vObjName,uVar1 + 1,0);
        if ((p->vObjName).nSize <= (int)uVar1) goto LAB_0034a355;
        piVar8 = (p->vObjName).pArray + lVar10;
        pCVar4 = p->pDesign;
      }
      else {
        if (vNameIds->nSize <= lVar12) {
LAB_0034a355:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar8 = (int *)((long)vNameIds->pArray + lVar14);
      }
      pcVar5 = Abc_NamStr(pCVar4->pStrs,*piVar8);
      sprintf(local_418,"%s_%s_%d",pcVar7,pcVar5,(ulong)uVar1);
      sVar6 = strlen(local_418);
      pcVar7 = (char *)malloc(sVar6 + 1);
      strcpy(pcVar7,local_418);
      uVar1 = __ptr[1];
      uVar2 = *__ptr;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar3 = malloc(0x80);
          }
          else {
            pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar9 = 0x10;
        }
        else {
          uVar9 = uVar2 * 2;
          if ((int)uVar9 <= (int)uVar2) goto LAB_0034a25e;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar3 = malloc((ulong)uVar2 << 4);
          }
          else {
            pvVar3 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar3;
        *__ptr = uVar9;
      }
LAB_0034a25e:
      __ptr[1] = uVar1 + 1;
      *(char **)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = pcVar7;
      lVar12 = lVar12 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar12 < vObjs->nSize);
  }
  uVar1 = __ptr[1];
  sVar6 = (size_t)(int)uVar1;
  if (1 < (long)sVar6) {
    qsort(*(void **)(__ptr + 2),sVar6,8,Cba_StrCmp);
  }
  vObjs->nSize = 0;
  if (0 < (int)uVar1) {
    lVar12 = *(long *)(__ptr + 2);
    sVar13 = 0;
    do {
      pcVar7 = strrchr(*(char **)(lVar12 + sVar13 * 8),0x5f);
      Entry = atoi(pcVar7 + 1);
      Vec_IntPush(vObjs,Entry);
      sVar13 = sVar13 + 1;
    } while (sVar6 != sVar13);
  }
  if (0 < (int)uVar1) {
    lVar12 = *(long *)(__ptr + 2);
    sVar13 = 0;
    do {
      pvVar3 = *(void **)(lVar12 + sVar13 * 8);
      if ((void *)0x2 < pvVar3) {
        free(pvVar3);
      }
      sVar13 = sVar13 + 1;
    } while (sVar6 != sVar13);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Cba_NtkObjOrder( Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vNameIds )
{
    char Buffer[1000], * pName;
    Vec_Ptr_t * vNames;
    int i, iObj;
    if ( Vec_IntSize(vObjs) < 2 )
        return;
    vNames = Vec_PtrAlloc( Vec_IntSize(vObjs) );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        char * pTypeName = Cba_NtkTypeName( p, Cba_ObjType(p, iObj) );
        char * pInstName = vNameIds ? Cba_NtkStr(p, Vec_IntEntry(vNameIds, i)) : Cba_ObjNameStr(p, iObj);
        sprintf( Buffer, "%s_%s_%d", pTypeName, pInstName, iObj );
        Vec_PtrPush( vNames, Abc_UtilStrsav(Buffer) );
    }
    // print before
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // do the sorting
    Vec_PtrSort( vNames, (int (*)(void))Cba_StrCmp );
    // print after
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // reload in a new order
    Vec_IntClear( vObjs );
    Vec_PtrForEachEntry( char *, vNames, pName, i )
        Vec_IntPush( vObjs, atoi(strrchr(pName, '_')+1) );
    Vec_PtrFreeFree( vNames );
}